

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.h
# Opt level: O2

void __thiscall
cxxopts::exceptions::invalid_option_format::~invalid_option_format(invalid_option_format *this)

{
  exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit invalid_option_format(const std::string& format)
  : specification("Invalid option format " + LQUOTE + format + RQUOTE)
  {
  }